

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterSystem.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterSystem::ClearUnderwaterAcousticEmitterBeams
          (UnderwaterAcousticEmitterSystem *this)

{
  pointer pUVar1;
  pointer pUVar2;
  pointer pUVar3;
  
  this->m_ui8EmitterSystemDataLength = '\x05';
  pUVar1 = (this->m_vUAEB).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (this->m_vUAEB).
           super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pUVar3 = pUVar1;
  if (pUVar2 != pUVar1) {
    do {
      (**(pUVar3->super_DataTypeBase)._vptr_DataTypeBase)(pUVar3);
      pUVar3 = pUVar3 + 1;
    } while (pUVar3 != pUVar2);
    (this->m_vUAEB).
    super__Vector_base<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam,_std::allocator<KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar1;
  }
  this->m_ui8NumBeams = '\0';
  return;
}

Assistant:

void UnderwaterAcousticEmitterSystem::ClearUnderwaterAcousticEmitterBeams()
{
    m_ui8EmitterSystemDataLength = UNDERWATER_ACOUSTIC_EMITTER_SYSTEM_SIZE / 4;
    m_vUAEB.clear();
    m_ui8NumBeams = 0;
}